

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

void __thiscall
icu_63::Normalizer2Impl::makeCanonIterDataFromNorm16
          (Normalizer2Impl *this,UChar32 start,UChar32 end,uint16_t norm16,CanonIterData *newData,
          UErrorCode *errorCode)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint16_t uVar3;
  ushort uVar4;
  uint32_t uVar5;
  int iVar6;
  uint32_t uVar7;
  uint uVar8;
  undefined6 in_register_0000000a;
  ulong uVar9;
  uint decompLead;
  int iVar10;
  uint uVar11;
  UChar32 c;
  uint32_t value;
  
  uVar8 = (uint)CONCAT62(in_register_0000000a,norm16);
  if ((uVar8 != 1) && ((norm16 < this->minYesNo || (this->minNoNo <= norm16)))) {
    for (; start <= end; start = start + 1) {
      uVar5 = umutablecptrie_get_63(newData->mutableTrie,start);
      if (norm16 < this->minMaybeYes) {
        uVar4 = this->minYesNo;
        if (norm16 < uVar4) {
          value = uVar5 | 0x40000000;
          goto LAB_0028ba53;
        }
        iVar10 = start;
        uVar11 = uVar8;
        if (this->limitNoNo <= norm16) {
          iVar10 = (start + (uint)(norm16 >> 3)) - (uint)this->centerNoNoDelta;
          uVar3 = getRawNorm16(this,iVar10);
          uVar11 = (uint)uVar3;
          uVar4 = this->minYesNo;
        }
        if (uVar4 < (ushort)uVar11) {
          puVar2 = this->extraData;
          uVar9 = (ulong)(uVar11 & 0xfffe);
          uVar4 = *(ushort *)((long)puVar2 + uVar9);
          value = uVar5;
          if (((start == iVar10) && ((uVar4 & 0x80) != 0)) &&
             (value = uVar5 | 0x80000000, *(char *)((long)puVar2 + (uVar9 - 2)) == '\0')) {
            value = uVar5;
          }
          if ((uVar4 & 0x1f) != 0) {
            uVar1 = *(ushort *)((long)puVar2 + uVar9 + 2);
            decompLead = (uint)uVar1;
            if ((decompLead & 0xfc00) == 0xd800) {
              decompLead = (uint)uVar1 * 0x400 + (uint)*(ushort *)((long)puVar2 + uVar9 + 4) +
                           0xfca02400;
              iVar10 = 2;
            }
            else {
              iVar10 = 1;
            }
            CanonIterData::addToStartSet(newData,start,decompLead,errorCode);
            if (this->minNoNo <= (ushort)uVar11) {
              while (iVar10 < (int)(uVar4 & 0x1f)) {
                iVar6 = iVar10 + 1;
                uVar1 = *(ushort *)((long)puVar2 + (long)iVar10 * 2 + uVar9 + 2);
                uVar11 = (uint)uVar1;
                if ((uVar11 & 0xfc00) == 0xd800) {
                  uVar11 = (uint)uVar1 * 0x400 +
                           (uint)*(ushort *)((long)puVar2 + (long)iVar6 * 2 + uVar9 + 2) +
                           0xfca02400;
                  iVar6 = iVar10 + 2;
                }
                uVar7 = umutablecptrie_get_63(newData->mutableTrie,uVar11);
                iVar10 = iVar6;
                if (-1 < (int)uVar7) {
                  umutablecptrie_set_63(newData->mutableTrie,uVar11,uVar7 | 0x80000000,errorCode);
                }
              }
            }
          }
          goto LAB_0028ba53;
        }
        CanonIterData::addToStartSet(newData,start,iVar10,errorCode);
      }
      else {
        value = uVar5 | (norm16 < 0xfc00 | 0xfffffffe) << 0x1e;
LAB_0028ba53:
        if (value != uVar5) {
          umutablecptrie_set_63(newData->mutableTrie,start,value,errorCode);
        }
      }
    }
  }
  return;
}

Assistant:

void Normalizer2Impl::makeCanonIterDataFromNorm16(UChar32 start, UChar32 end, const uint16_t norm16,
                                                  CanonIterData &newData,
                                                  UErrorCode &errorCode) const {
    if(isInert(norm16) || (minYesNo<=norm16 && norm16<minNoNo)) {
        // Inert, or 2-way mapping (including Hangul syllable).
        // We do not write a canonStartSet for any yesNo character.
        // Composites from 2-way mappings are added at runtime from the
        // starter's compositions list, and the other characters in
        // 2-way mappings get CANON_NOT_SEGMENT_STARTER set because they are
        // "maybe" characters.
        return;
    }
    for(UChar32 c=start; c<=end; ++c) {
        uint32_t oldValue = umutablecptrie_get(newData.mutableTrie, c);
        uint32_t newValue=oldValue;
        if(isMaybeOrNonZeroCC(norm16)) {
            // not a segment starter if it occurs in a decomposition or has cc!=0
            newValue|=CANON_NOT_SEGMENT_STARTER;
            if(norm16<MIN_NORMAL_MAYBE_YES) {
                newValue|=CANON_HAS_COMPOSITIONS;
            }
        } else if(norm16<minYesNo) {
            newValue|=CANON_HAS_COMPOSITIONS;
        } else {
            // c has a one-way decomposition
            UChar32 c2=c;
            // Do not modify the whole-range norm16 value.
            uint16_t norm16_2=norm16;
            if (isDecompNoAlgorithmic(norm16_2)) {
                // Maps to an isCompYesAndZeroCC.
                c2 = mapAlgorithmic(c2, norm16_2);
                norm16_2 = getRawNorm16(c2);
                // No compatibility mappings for the CanonicalIterator.
                U_ASSERT(!(isHangulLV(norm16_2) || isHangulLVT(norm16_2)));
            }
            if (norm16_2 > minYesNo) {
                // c decomposes, get everything from the variable-length extra data
                const uint16_t *mapping=getMapping(norm16_2);
                uint16_t firstUnit=*mapping;
                int32_t length=firstUnit&MAPPING_LENGTH_MASK;
                if((firstUnit&MAPPING_HAS_CCC_LCCC_WORD)!=0) {
                    if(c==c2 && (*(mapping-1)&0xff)!=0) {
                        newValue|=CANON_NOT_SEGMENT_STARTER;  // original c has cc!=0
                    }
                }
                // Skip empty mappings (no characters in the decomposition).
                if(length!=0) {
                    ++mapping;  // skip over the firstUnit
                    // add c to first code point's start set
                    int32_t i=0;
                    U16_NEXT_UNSAFE(mapping, i, c2);
                    newData.addToStartSet(c, c2, errorCode);
                    // Set CANON_NOT_SEGMENT_STARTER for each remaining code point of a
                    // one-way mapping. A 2-way mapping is possible here after
                    // intermediate algorithmic mapping.
                    if(norm16_2>=minNoNo) {
                        while(i<length) {
                            U16_NEXT_UNSAFE(mapping, i, c2);
                            uint32_t c2Value = umutablecptrie_get(newData.mutableTrie, c2);
                            if((c2Value&CANON_NOT_SEGMENT_STARTER)==0) {
                                umutablecptrie_set(newData.mutableTrie, c2,
                                                   c2Value|CANON_NOT_SEGMENT_STARTER, &errorCode);
                            }
                        }
                    }
                }
            } else {
                // c decomposed to c2 algorithmically; c has cc==0
                newData.addToStartSet(c, c2, errorCode);
            }
        }
        if(newValue!=oldValue) {
            umutablecptrie_set(newData.mutableTrie, c, newValue, &errorCode);
        }
    }
}